

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_message.c
# Opt level: O0

char * mqttmessage_getTopicName(MQTT_MESSAGE_HANDLE handle)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  char *result;
  MQTT_MESSAGE_HANDLE handle_local;
  
  if (handle == (MQTT_MESSAGE_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_message.c"
                ,"mqttmessage_getTopicName",199,1,"Invalid Parameter handle: %p.",0);
    }
    l = (LOGGER_LOG)0x0;
  }
  else if (handle->topicName == (char *)0x0) {
    l = (LOGGER_LOG)handle->const_topic_name;
  }
  else {
    l = (LOGGER_LOG)handle->topicName;
  }
  return (char *)l;
}

Assistant:

const char* mqttmessage_getTopicName(MQTT_MESSAGE_HANDLE handle)
{
    const char* result;
    if (handle == NULL)
    {
        /* Codes_SRS_MQTTMESSAGE_07_012: [If handle is NULL then mqttmessage_getTopicName shall return a NULL string.] */
        LogError("Invalid Parameter handle: %p.", handle);
        result = NULL;
    }
    else
    {
        /* Codes_SRS_MQTTMESSAGE_07_013: [mqttmessage_getTopicName shall return the topicName contained in MQTT_MESSAGE_HANDLE handle.] */
        if (handle->topicName == NULL)
        {
            result = handle->const_topic_name;
        }
        else
        {
            result = handle->topicName;
        }
    }
    return result;
}